

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O0

void __thiscall DISTRHO::Plugin::PrivateData::~PrivateData(PrivateData *this)

{
  AudioPortWithBusId *pAVar1;
  Parameter *pPVar2;
  PortGroupWithId *pPVar3;
  AudioPortWithBusId *this_00;
  Parameter *this_01;
  PortGroupWithId *this_02;
  PrivateData *this_local;
  
  if (this->audioPorts != (AudioPortWithBusId *)0x0) {
    pAVar1 = this->audioPorts;
    if (pAVar1 != (AudioPortWithBusId *)0x0) {
      this_00 = pAVar1 + *(long *)&pAVar1[-1].super_AudioPort.groupId;
      while (pAVar1 != this_00) {
        this_00 = this_00 + -1;
        AudioPortWithBusId::~AudioPortWithBusId(this_00);
      }
      operator_delete__(&pAVar1[-1].super_AudioPort.groupId);
    }
    this->audioPorts = (AudioPortWithBusId *)0x0;
  }
  if (this->parameters != (Parameter *)0x0) {
    pPVar2 = this->parameters;
    if (pPVar2 != (Parameter *)0x0) {
      this_01 = pPVar2 + *(long *)&pPVar2[-1].groupId;
      while (pPVar2 != this_01) {
        this_01 = this_01 + -1;
        Parameter::~Parameter(this_01);
      }
      operator_delete__(&pPVar2[-1].groupId);
    }
    this->parameters = (Parameter *)0x0;
  }
  if (this->portGroups != (PortGroupWithId *)0x0) {
    pPVar3 = this->portGroups;
    if (pPVar3 != (PortGroupWithId *)0x0) {
      this_02 = pPVar3 + *(long *)&pPVar3[-1].groupId;
      while (pPVar3 != this_02) {
        this_02 = this_02 + -1;
        PortGroupWithId::~PortGroupWithId(this_02);
      }
      operator_delete__(&pPVar3[-1].groupId);
    }
    this->portGroups = (PortGroupWithId *)0x0;
  }
  if (this->bundlePath != (char *)0x0) {
    free(this->bundlePath);
    this->bundlePath = (char *)0x0;
  }
  return;
}

Assistant:

~PrivateData() noexcept
    {
#if DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS > 0
        if (audioPorts != nullptr)
        {
            delete[] audioPorts;
            audioPorts = nullptr;
        }
#endif

        if (parameters != nullptr)
        {
            delete[] parameters;
            parameters = nullptr;
        }

        if (portGroups != nullptr)
        {
            delete[] portGroups;
            portGroups = nullptr;
        }

#if DISTRHO_PLUGIN_WANT_PROGRAMS
        if (programNames != nullptr)
        {
            delete[] programNames;
            programNames = nullptr;
        }
#endif

#if DISTRHO_PLUGIN_WANT_STATE
        if (stateKeys != nullptr)
        {
            delete[] stateKeys;
            stateKeys = nullptr;
        }

        if (stateDefValues != nullptr)
        {
            delete[] stateDefValues;
            stateDefValues = nullptr;
        }
#endif

        if (bundlePath != nullptr)
        {
            std::free(bundlePath);
            bundlePath = nullptr;
        }
    }